

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O1

void CheckRDFaPrefix(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  bool bVar1;
  uint uVar2;
  tmbstr s1;
  char *__s;
  char *pcVar3;
  
  if ((attval == (AttVal *)0x0) || (attval->value == (ctmbstr)0x0)) {
    prvTidyReportAttrError(doc,node,attval,0x256);
    return;
  }
  uVar2 = prvTidytmbstrlen(attval->value);
  s1 = (tmbstr)(*doc->allocator->vtbl->alloc)(doc->allocator,(long)uVar2 + 1);
  *s1 = '\0';
  prvTidytmbstrcpy(s1,attval->value);
  __s = strtok(s1," ");
  if (__s != (char *)0x0) {
    bVar1 = true;
    do {
      if (bVar1) {
        pcVar3 = strchr(__s,0x3a);
        if (pcVar3 != (char *)0x0) {
          uVar2 = prvTidytmbstrlen(__s);
          if (pcVar3 == __s + ((ulong)uVar2 - 1)) goto LAB_00139448;
        }
        prvTidyReportAttrError(doc,node,attval,0x22b);
      }
LAB_00139448:
      bVar1 = (bool)(bVar1 ^ 1);
      __s = strtok((char *)0x0," ");
    } while (__s != (char *)0x0);
  }
  (*doc->allocator->vtbl->free)(doc->allocator,s1);
  return;
}

Assistant:

void CheckRDFaPrefix ( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    /* Copy the attribute value so we can split it */
    if (attval->value) {
        tmbstr t, tPtr ;

        uint prefixCount = 0;
        /* isPrefix toggles - start at 1 and change to 0 as we
         * iterate over the components of the value */
        uint isPrefix = 1;

        /* Copy it over */

        uint len = TY_(tmbstrlen)(attval->value);
        tmbstr s = (tmbstr) TidyDocAlloc( doc, len + 1 );
        s[0] = '\0';
        TY_(tmbstrcpy)( s, attval->value );

        /* iterate over value */
        tPtr = s;

        while ( ( t = strtok(tPtr, " ") ) != NULL ) {
            tPtr = NULL;
            if (isPrefix) {
                /* this piece should be a prefix */
                /* prefix rules are that it can have any
                 * character except a colon - that one must be
                 * at the end */
                tmbstr i = strchr(t, ':') ;
                if (i == NULL) {
                    /* no colon - bad! */
                    TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
                } else if (i != ( t + TY_(tmbstrlen)(t) - 1) ) {
                    /* not at the end - also bad */
                    TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
                }
            } else {
                /* this piece should be a URL */
                prefixCount ++;
            }
            isPrefix = !isPrefix;
        }
        TidyDocFree( doc, s ) ;
    }
}